

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int trex_element(TRex *exp)

{
  char cVar1;
  bool bVar2;
  undefined2 uVar3;
  int iVar4;
  ushort **ppuVar5;
  int nnode_1;
  int nnode;
  unsigned_short p1;
  unsigned_short p0;
  TRexBool isgreedy;
  int newn;
  int expr;
  int ret;
  TRex *exp_local;
  
  cVar1 = *exp->_p;
  if (cVar1 == '$') {
    exp->_p = exp->_p + 1;
    newn = trex_newnode(exp,0x10a);
  }
  else if (cVar1 == '(') {
    exp->_p = exp->_p + 1;
    if (*exp->_p == '?') {
      exp->_p = exp->_p + 1;
      trex_expect(exp,0x3a);
      isgreedy = trex_newnode(exp,0x103);
    }
    else {
      isgreedy = trex_newnode(exp,0x102);
    }
    iVar4 = trex_list(exp);
    exp->_nodes[(int)isgreedy].left = iVar4;
    newn = isgreedy;
    trex_expect(exp,0x29);
  }
  else if (cVar1 == '.') {
    exp->_p = exp->_p + 1;
    newn = trex_newnode(exp,0x104);
  }
  else if (cVar1 == '[') {
    exp->_p = exp->_p + 1;
    newn = trex_class(exp);
    trex_expect(exp,0x5d);
  }
  else {
    newn = trex_charnode(exp,0);
  }
  bVar2 = false;
  nnode_1 = 0;
  cVar1 = *exp->_p;
  if (cVar1 == '*') {
    nnode_1 = 0xffff;
    exp->_p = exp->_p + 1;
    bVar2 = true;
  }
  else if (cVar1 == '+') {
    nnode_1 = 0x1ffff;
    exp->_p = exp->_p + 1;
    bVar2 = true;
  }
  else if (cVar1 == '?') {
    nnode_1 = 1;
    exp->_p = exp->_p + 1;
    bVar2 = true;
  }
  else if (cVar1 == '{') {
    exp->_p = exp->_p + 1;
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)*exp->_p] & 0x800) == 0) {
      trex_error(exp,"number expected");
    }
    iVar4 = trex_parsenumber(exp);
    uVar3 = (undefined2)iVar4;
    nnode_1 = iVar4 << 0x10;
    if (*exp->_p == ',') {
      exp->_p = exp->_p + 1;
      nnode_1 = CONCAT22(uVar3,0xffff);
      ppuVar5 = __ctype_b_loc();
      if (((*ppuVar5)[(int)*exp->_p] & 0x800) != 0) {
        iVar4 = trex_parsenumber(exp);
        nnode_1 = CONCAT22(uVar3,(short)iVar4);
      }
      trex_expect(exp,0x7d);
    }
    else if (*exp->_p == '}') {
      nnode_1 = CONCAT22(uVar3,uVar3);
      exp->_p = exp->_p + 1;
    }
    else {
      trex_error(exp,", or } expected");
    }
    bVar2 = true;
  }
  if (bVar2) {
    iVar4 = trex_newnode(exp,0x100);
    exp->_nodes[iVar4].left = newn;
    exp->_nodes[iVar4].right = nnode_1;
    newn = iVar4;
  }
  if ((((*exp->_p != '|') && (*exp->_p != ')')) && (*exp->_p != '*')) &&
     ((*exp->_p != '+' && (*exp->_p != '\0')))) {
    iVar4 = trex_element(exp);
    exp->_nodes[newn].next = iVar4;
  }
  return newn;
}

Assistant:

static int trex_element(TRex * exp) {
	int ret = -1;

	switch (*exp->_p) {
		case '(': {
			int expr, newn;
			exp->_p++;


			if (*exp->_p == '?') {
				exp->_p++;
				trex_expect(exp, ':');
				expr = trex_newnode(exp, OP_NOCAPEXPR);
			} else {
				expr = trex_newnode(exp, OP_EXPR);
			}

			newn = trex_list(exp);
			exp->_nodes[expr].left = newn;
			ret = expr;
			trex_expect(exp, ')');
		}
		break;

		case '[':
			exp->_p++;
			ret = trex_class(exp);
			trex_expect(exp, ']');
			break;

		case TREX_SYMBOL_END_OF_STRING:
			exp->_p++;
			ret = trex_newnode(exp, OP_EOL);
			break;

		case TREX_SYMBOL_ANY_CHAR:
			exp->_p++;
			ret = trex_newnode(exp, OP_DOT);
			break;

		default:
			ret = trex_charnode(exp, TRex_False);
			break;
	}

	{
		TRexBool isgreedy = TRex_False;
		unsigned short p0 = 0, p1 = 0;

		switch (*exp->_p) {
			case TREX_SYMBOL_GREEDY_ZERO_OR_MORE:
				p0 = 0;
				p1 = 0xFFFF;
				exp->_p++;
				isgreedy = TRex_True;
				break;

			case TREX_SYMBOL_GREEDY_ONE_OR_MORE:
				p0 = 1;
				p1 = 0xFFFF;
				exp->_p++;
				isgreedy = TRex_True;
				break;

			case TREX_SYMBOL_GREEDY_ZERO_OR_ONE:
				p0 = 0;
				p1 = 1;
				exp->_p++;
				isgreedy = TRex_True;
				break;

			case '{':
				exp->_p++;

				if (!isdigit(*exp->_p)) {
					trex_error(exp, _SC("number expected"));
				}

				p0 = (unsigned short)trex_parsenumber(exp);

				/*******************************/
				switch (*exp->_p) {
					case '}':
						p1 = p0;
						exp->_p++;
						break;

					case ',':
						exp->_p++;
						p1 = 0xFFFF;

						if (isdigit(*exp->_p)) {
							p1 = (unsigned short)trex_parsenumber(exp);
						}

						trex_expect(exp, '}');
						break;

					default:
						trex_error(exp, _SC(", or } expected"));
				}

				/*******************************/
				isgreedy = TRex_True;
				break;

		}

		if (isgreedy) {
			int nnode = trex_newnode(exp, OP_GREEDY);
			exp->_nodes[nnode].left = ret;
			exp->_nodes[nnode].right = ((p0) << 16) | p1;
			ret = nnode;
		}
	}

	if ((*exp->_p != TREX_SYMBOL_BRANCH) && (*exp->_p != ')') && (*exp->_p != TREX_SYMBOL_GREEDY_ZERO_OR_MORE) && (*exp->_p != TREX_SYMBOL_GREEDY_ONE_OR_MORE) && (*exp->_p != '\0')) {
		int nnode = trex_element(exp);
		exp->_nodes[ret].next = nnode;
	}

	return ret;
}